

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O2

json_value * json_parse_ex(json_settings *settings,char *json,size_t length,char *error_buf)

{
  json_value *pjVar1;
  char cVar2;
  json_type jVar3;
  double dVar4;
  ushort uVar5;
  bool bVar6;
  _func_void_void_ptr_void_ptr *p_Var7;
  void *pvVar8;
  uchar uVar9;
  uchar uVar10;
  byte bVar11;
  int iVar12;
  ushort **ppuVar13;
  long lVar14;
  anon_union_8_2_291a86ad_for__reserved *paVar15;
  json_value **ppjVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  byte bVar21;
  _json_value *p_Var22;
  char *pcVar23;
  uint uVar24;
  json_value *pjVar25;
  uint uVar26;
  json_value *pjVar27;
  uint uVar28;
  _json_value *local_198;
  json_value *local_188;
  long local_180;
  ulong local_178;
  json_value *root;
  json_state local_168;
  json_value *local_100;
  json_value *local_f8;
  long local_f0;
  long local_e8;
  double local_e0;
  uint local_d4;
  json_value *local_d0;
  json_value *local_c8;
  char *local_c0;
  char error [128];
  
  local_100 = (json_value *)0x0;
  local_168.cur_line = 0;
  local_168.cur_col = 0;
  local_168.first_pass = 0;
  local_168._76_4_ = 0;
  local_168.used_memory = 0;
  if ((((2 < length) && (*json == -0x11)) && (json[1] == -0x45)) && (json[2] == -0x41)) {
    json = json + 3;
    length = length - 3;
  }
  error._0_8_ = error._0_8_ & 0xffffffffffffff00;
  local_168.settings.max_memory = settings->max_memory;
  local_168.settings._8_8_ = *(undefined8 *)&settings->settings;
  local_168.settings.mem_alloc = settings->mem_alloc;
  local_168.settings.mem_free = settings->mem_free;
  local_168.settings.user_data = settings->user_data;
  local_168.settings.value_extra = settings->value_extra;
  if (local_168.settings.mem_alloc == (_func_void_ptr_size_t_int_void_ptr *)0x0) {
    local_168.settings.mem_alloc = default_alloc;
  }
  pjVar25 = (json_value *)((long)&((json_value *)json)->parent + length);
  if (local_168.settings.mem_free == (_func_void_void_ptr_void_ptr *)0x0) {
    local_168.settings.mem_free = default_free;
  }
  local_168.uint_max = 0xfffffff7;
  local_168._12_4_ = 0;
  local_168.ulong_max = 0xfffffffffffffff7;
  root = (json_value *)((long)&pjVar25[-1]._reserved + 7);
  iVar12 = 1;
  local_180 = 0;
  local_f0 = 0;
  local_e8 = 0;
  local_d0 = (json_value *)json;
  local_c8 = root;
  local_c0 = error_buf;
  do {
    uVar24 = 8;
    bVar6 = false;
    local_168.first_pass = iVar12;
    if (iVar12 < 0) {
      return root;
    }
    root = (json_value *)0x0;
    local_188 = (json_value *)0x0;
    local_168.cur_line = 1;
    local_198 = (_json_value *)0x0;
    uVar18 = 0;
    pjVar27 = local_d0;
LAB_00103ee1:
    uVar26 = (uint)uVar18;
    local_168.ptr = (char *)pjVar27;
    if (pjVar27 == pjVar25) {
      if ((uVar24 & 0x20) == 0) {
        uVar28 = 0;
        goto LAB_00103f45;
      }
LAB_00104da1:
      uVar20 = local_168._88_8_ & 0xffffffff;
      uVar18 = (ulong)local_168.cur_col;
      pcVar23 = "Unexpected EOF in string (at %d:%d)";
      goto LAB_00104dcd;
    }
    bVar11 = *(byte *)&pjVar27->parent;
    uVar28 = (uint)bVar11;
    if ((uVar24 & 0x20) != 0) {
      if (bVar11 == 0) goto LAB_00104da1;
      if (local_168.uint_max < uVar26) {
LAB_00104db8:
        uVar20 = local_168._88_8_ & 0xffffffff;
        uVar18 = (ulong)local_168._88_8_ >> 0x20;
        pcVar23 = "%d:%d: Too long (caught overflow)";
LAB_00104dcd:
        sprintf(error,pcVar23,uVar20,uVar18);
        goto LAB_00104ddc;
      }
      uVar20 = uVar18 & 0xffffffff;
      if ((uVar24 & 0x10) == 0) {
        if (bVar11 == 0x22) {
          if (local_168.first_pass == 0) {
            *(undefined1 *)((long)&local_198->parent + uVar20) = 0;
          }
          uVar24 = uVar24 & 0xffffffcf;
          if (local_188->type != json_object) {
            uVar28 = 0x22;
            if (local_188->type == json_string) {
              (local_188->u).string.length = uVar26;
              bVar6 = true;
            }
            local_198 = (_json_value *)0x0;
            goto LAB_00103f45;
          }
          if (local_168.first_pass == 0) {
            *(anon_union_8_2_291a86ad_for__reserved *)
             ((local_188->u).string.ptr + (ulong)(local_188->u).string.length * 0x18) =
                 local_188->_reserved;
            paVar15 = &local_188->_reserved;
            (local_188->u).object.values[(local_188->u).string.length].name_length = uVar26;
          }
          else {
            paVar15 = (anon_union_8_2_291a86ad_for__reserved *)&(local_188->u).object.values;
          }
          paVar15->next_alloc =
               (_json_value *)((long)&paVar15->next_alloc->parent + (ulong)(uVar26 + 1));
          uVar24 = uVar24 | 0x48;
          local_198 = (_json_value *)0x0;
        }
        else {
          if (bVar11 != 0x5c) goto switchD_00104081_caseD_6f;
          uVar24 = uVar24 | 0x10;
        }
        goto LAB_0010464c;
      }
      uVar24 = uVar24 & 0xffffffef;
      switch(bVar11) {
      case 0x6e:
        if (local_168.first_pass == 0) {
          *(undefined1 *)((long)&local_198->parent + uVar20) = 10;
        }
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
switchD_00104081_caseD_6f:
        if (local_168.first_pass == 0) {
          *(byte *)((long)&local_198->parent + uVar20) = bVar11;
        }
        break;
      case 0x72:
        if (local_168.first_pass == 0) {
          *(undefined1 *)((long)&local_198->parent + uVar20) = 0xd;
        }
        break;
      case 0x74:
        if (local_168.first_pass == 0) {
          *(undefined1 *)((long)&local_198->parent + uVar20) = 9;
        }
        break;
      case 0x75:
        local_178 = uVar18;
        if (3 < (long)pjVar25 - (long)pjVar27) {
          local_168.ptr = (char *)((long)&pjVar27->parent + 1);
          uVar9 = hex_value(*(char *)((long)&pjVar27->parent + 1));
          if (uVar9 != 0xff) {
            local_168.ptr = (char *)((long)&pjVar27->parent + 2);
            uVar10 = hex_value(*(char *)((long)&pjVar27->parent + 2));
            local_f8 = (json_value *)CONCAT71(local_f8._1_7_,uVar10);
            if (uVar10 != 0xff) {
              local_168.ptr = (char *)((long)&pjVar27->parent + 3);
              uVar10 = hex_value(*(char *)((long)&pjVar27->parent + 3));
              if (uVar10 != 0xff) {
                pjVar1 = (json_value *)((long)&pjVar27->parent + 4);
                local_168.ptr = (char *)pjVar1;
                bVar11 = hex_value(*(char *)((long)&pjVar27->parent + 4));
                if (bVar11 != 0xff) {
                  bVar21 = uVar9 << 4 | (byte)local_f8;
                  bVar11 = bVar11 | uVar10 << 4;
                  uVar5 = CONCAT11(bVar21,bVar11);
                  uVar26 = (uint)uVar5;
                  if ((byte)(uVar9 << 4 | (byte)local_f8 & 0xf8) != 0xd8) {
                    if (uVar26 < 0x80) {
                      uVar18 = local_178;
                      if (local_168.first_pass == 0) {
                        *(byte *)((long)&local_198->parent + uVar20) = bVar11;
                      }
                      break;
                    }
                    iVar12 = (int)local_178;
                    if (bVar21 < 8) {
                      if (local_168.first_pass == 0) {
                        *(byte *)((long)&local_198->parent + uVar20) = (byte)(uVar5 >> 6) | 0xc0;
                        *(byte *)((long)&local_198->parent + (ulong)(iVar12 + 1)) =
                             bVar11 & 0x3f | 0x80;
                        uVar18 = (ulong)(iVar12 + 2);
                      }
                      else {
                        uVar18 = (ulong)(iVar12 + 2);
                      }
                    }
                    else if (local_168.first_pass == 0) {
                      *(byte *)((long)&local_198->parent + uVar20) = bVar21 >> 4 | 0xe0;
                      *(byte *)((long)&local_198->parent + (ulong)(iVar12 + 1)) =
                           (byte)(uVar5 >> 6) & 0x3f | 0x80;
                      *(byte *)((long)&local_198->parent + (ulong)(iVar12 + 2)) =
                           bVar11 & 0x3f | 0x80;
                      uVar18 = (ulong)(iVar12 + 3);
                    }
                    else {
                      uVar18 = (ulong)(iVar12 + 3);
                    }
                    goto LAB_0010464c;
                  }
                  local_e0 = (double)CONCAT71(local_e0._1_7_,bVar11);
                  local_d4 = uVar26;
                  if (((5 < (long)pjVar25 - (long)pjVar1) &&
                      (local_168.ptr = (char *)((long)&pjVar27->parent + 5),
                      *(char *)((long)&pjVar27->parent + 5) == '\\')) &&
                     (local_168.ptr = (char *)((long)&pjVar27->parent + 6),
                     *(char *)((long)&pjVar27->parent + 6) == 'u')) {
                    local_168.ptr = (char *)((long)&pjVar27->parent + 7);
                    uVar9 = hex_value(*(char *)((long)&pjVar27->parent + 7));
                    if (uVar9 != 0xff) {
                      local_168.ptr = (char *)&pjVar27->type;
                      bVar11 = hex_value((char)pjVar27->type);
                      if (bVar11 != 0xff) {
                        local_168.ptr = (char *)((long)&pjVar27->type + 1);
                        uVar9 = hex_value(*(byte *)((long)&pjVar27->type + 1));
                        if (uVar9 != 0xff) {
                          local_168.ptr = (char *)((long)&pjVar27->type + 2);
                          bVar21 = hex_value(*(byte *)((long)&pjVar27->type + 2));
                          if (bVar21 != 0xff) {
                            iVar12 = (int)local_178;
                            if (local_168.first_pass == 0) {
                              bVar21 = bVar21 | uVar9 << 4;
                              *(byte *)((long)&local_198->parent + uVar20) =
                                   (byte)local_f8 & 3 | 0xf0;
                              *(byte *)((long)&local_198->parent + (ulong)(iVar12 + 1)) =
                                   local_e0._0_1_ >> 2 | 0x90;
                              *(byte *)((long)&local_198->parent + (ulong)(iVar12 + 2)) =
                                   (byte)(((bVar11 & 3) << 8 | (uint)bVar21 | local_d4 << 10) >> 6)
                                   & 0x3f | 0x80;
                              *(byte *)((long)&local_198->parent + (ulong)(iVar12 + 3)) =
                                   bVar21 & 0x3f | 0x80;
                            }
                            uVar18 = (ulong)(iVar12 + 4);
                            goto LAB_0010464c;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        uVar19 = local_168._88_8_ & 0xffffffff;
        uVar20 = (ulong)local_168._88_8_ >> 0x20;
        pcVar23 = "Invalid character value `%c` (at %d:%d)";
        uVar18 = 0x75;
        goto LAB_00104f16;
      default:
        if (bVar11 == 0x66) {
          if (local_168.first_pass == 0) {
            *(undefined1 *)((long)&local_198->parent + uVar20) = 0xc;
          }
        }
        else {
          if (bVar11 != 0x62) goto switchD_00104081_caseD_6f;
          if (local_168.first_pass == 0) {
            *(undefined1 *)((long)&local_198->parent + uVar20) = 8;
          }
        }
      }
      uVar18 = (ulong)((int)uVar18 + 1);
LAB_0010464c:
      pjVar27 = (json_value *)((long)(_json_value **)local_168.ptr + 1);
      goto LAB_00103ee1;
    }
LAB_00103f45:
    bVar11 = (byte)uVar28;
    if ((local_168.settings._8_8_ & 1) != 0) {
      if ((uVar24 & 0x6000) != 0) {
        if ((uVar24 >> 0xd & 1) == 0) {
          if ((uVar24 >> 0xe & 1) == 0) goto LAB_00103f54;
          if (bVar11 == 0x2a) {
            if ((pjVar27 < local_c8) && (*(char *)((long)&pjVar27->parent + 1) == '/')) {
              uVar24 = uVar24 & 0xffff9fff;
              local_168.ptr = (char *)((long)&pjVar27->parent + 1);
            }
          }
          else if (uVar28 == 0) {
            uVar20 = local_168._88_8_ & 0xffffffff;
            uVar18 = (ulong)local_168.cur_col;
            pcVar23 = "%d:%d: Unexpected EOF in block comment";
            goto LAB_00104dcd;
          }
        }
        else if ((bVar11 < 0xe) && ((0x2401U >> (uVar28 & 0x1f) & 1) != 0)) {
          uVar24 = uVar24 & 0xffffdfff;
          local_168.ptr = (char *)((long)&pjVar27[-1]._reserved + 7);
        }
        goto LAB_0010464c;
      }
      if (bVar11 != 0x2f) goto LAB_00103f54;
      if (((uVar24 & 0x88) == 0) && (local_188->type != json_object)) {
        uVar20 = local_168._88_8_ & 0xffffffff;
        uVar18 = (ulong)local_168.cur_col;
        pcVar23 = "%d:%d: Comment not allowed here";
        goto LAB_00104dcd;
      }
      local_168.ptr = (char *)((long)&pjVar27->parent + 1);
      if ((json_value *)local_168.ptr == pjVar25) {
        uVar20 = local_168._88_8_ & 0xffffffff;
        uVar18 = (ulong)local_168.cur_col;
        pcVar23 = "%d:%d: EOF unexpected";
        goto LAB_00104dcd;
      }
      cVar2 = *(char *)&((json_value *)local_168.ptr)->parent;
      if (cVar2 != '*') {
        if (cVar2 == '/') {
          uVar24 = uVar24 | 0x2000;
          goto LAB_0010464c;
        }
        uVar20 = (ulong)(uint)(int)cVar2;
        uVar18 = local_168._88_8_ & 0xffffffff;
        uVar19 = (ulong)local_168.cur_col;
        pcVar23 = "%d:%d: Unexpected `%c` in comment opening sequence";
        goto LAB_00104f16;
      }
      uVar24 = uVar24 | 0x4000;
      goto LAB_0010464c;
    }
LAB_00103f54:
    if (-1 < bVar6) {
      if ((uVar24 & 8) == 0) {
        jVar3 = local_188->type;
        uVar26 = uVar24;
        if (1 < jVar3 - json_integer) {
          if (jVar3 != json_object) goto LAB_0010487a;
          if (bVar11 == 9) goto LAB_0010464c;
          if (uVar28 == 0x7d) goto LAB_001044d9;
          if ((uVar28 == 0xd) || (uVar28 == 0x20)) goto LAB_0010464c;
          if (uVar28 == 0x22) {
            if ((uVar24 & 4) != 0) {
              uVar20 = local_168._88_8_ & 0xffffffff;
              uVar18 = (ulong)local_168.cur_col;
              pcVar23 = "%d:%d: Expected , before \"";
              goto LAB_00104dcd;
            }
            uVar26 = uVar24 | 0x20;
            local_198 = (local_188->_reserved).next_alloc;
            uVar18 = 0;
            goto LAB_0010487a;
          }
          if (uVar28 == 0x2c) {
            if ((uVar24 & 4) != 0) {
              uVar26 = uVar24 & 0xffffff73;
              goto LAB_0010487a;
            }
          }
          else if (uVar28 == 10) goto LAB_0010412a;
          uVar18 = local_168._88_8_ & 0xffffffff;
          uVar19 = (ulong)local_168.cur_col;
          pcVar23 = "%d:%d: Unexpected `%c` in object";
          goto LAB_00104ece;
        }
        local_f8 = local_188;
        local_178 = uVar18;
        ppuVar13 = __ctype_b_loc();
        uVar18 = local_178;
        if ((*(byte *)((long)*ppuVar13 + (long)(char)bVar11 * 2 + 1) & 8) == 0) {
          if (bVar11 != 0x2b) {
            if (uVar28 != 0x2e) {
              if (uVar28 == 0x2d) goto LAB_00103fd0;
              goto LAB_001045fb;
            }
            if (jVar3 == json_integer) {
              if (local_180 == 0) {
                uVar20 = local_168._88_8_ & 0xffffffff;
                uVar18 = (ulong)local_168.cur_col;
                pcVar23 = "%d:%d: Expected digit before `.`";
                goto LAB_00104dcd;
              }
              local_f8->type = json_double;
              (local_f8->u).dbl = (double)(local_f8->u).integer;
              goto LAB_001047f4;
            }
            if ((uVar24 >> 10 & 1) == 0) goto LAB_00104764;
LAB_00104802:
            if (local_180 == 0) {
              uVar20 = local_168._88_8_ & 0xffffffff;
              uVar18 = (ulong)local_168.cur_col;
              pcVar23 = "%d:%d: Expected digit after `e`";
              goto LAB_00104dcd;
            }
            lVar14 = -local_f0;
            if ((uVar24 >> 0xc & 1) == 0) {
              lVar14 = local_f0;
            }
            dVar4 = pow(10.0,(double)lVar14);
            (local_f8->u).dbl = dVar4 * (local_f8->u).dbl;
LAB_00104852:
            if ((uVar24 >> 8 & 1) != 0) {
              if (local_f8->type == json_integer) {
                (local_f8->u).integer = -(local_f8->u).integer;
              }
              else {
                (local_f8->u).integer = (local_f8->u).integer ^ 0x8000000000000000;
              }
            }
            goto LAB_00104876;
          }
LAB_00103fd0:
          if ((uVar24 & 0xc00) == 0x400) {
            uVar24 = (uint)(bVar11 == 0x2d) << 0xc | uVar24 | 0x800;
            goto LAB_0010464c;
          }
LAB_001045fb:
          if ((uVar24 >> 10 & 1) != 0) goto LAB_00104802;
          if (jVar3 == json_double) {
LAB_00104764:
            if (local_180 == 0) {
              uVar20 = local_168._88_8_ & 0xffffffff;
              uVar18 = (ulong)local_168.cur_col;
              pcVar23 = "%d:%d: Expected digit after `.`";
              goto LAB_00104dcd;
            }
            local_e0 = (double)local_e8;
            dVar4 = pow(10.0,(double)local_180);
            (local_f8->u).dbl = local_e0 / dVar4 + (local_f8->u).dbl;
          }
          if ((bVar11 & 0xdf) != 0x45) goto LAB_00104852;
          if (local_f8->type == json_integer) {
            local_f8->type = json_double;
            (local_f8->u).dbl = (double)(local_f8->u).integer;
          }
          uVar24 = uVar24 & 0xfffff977 | 0x400;
LAB_001047f4:
          local_180 = 0;
          uVar18 = local_178;
        }
        else {
          lVar14 = local_180 + 1;
          lVar17 = (long)(int)(char)bVar11;
          if ((jVar3 != json_integer) && ((uVar24 & 0x400) == 0)) {
            local_e8 = lVar17 + local_e8 * 10 + -0x30;
            local_180 = lVar14;
            goto LAB_0010464c;
          }
          if ((uVar24 >> 10 & 1) == 0) {
            if ((uVar24 >> 9 & 1) != 0) {
              uVar18 = local_168._88_8_ & 0xffffffff;
              uVar19 = (ulong)local_168.cur_col;
              pcVar23 = "%d:%d: Unexpected `0` before `%c`";
              goto LAB_00104ece;
            }
            uVar26 = uVar24 | 0x200;
            if (bVar11 != 0x30) {
              uVar26 = uVar24;
            }
            if (local_180 == 0) {
              uVar24 = uVar26;
            }
            (local_f8->u).integer = lVar17 + (local_f8->u).integer * 10 + -0x30;
            local_180 = lVar14;
          }
          else {
            uVar24 = uVar24 | 0x800;
            local_f0 = lVar17 + local_f0 * 10 + -0x30;
            local_180 = lVar14;
          }
        }
      }
      else {
        if (bVar11 == 9) goto LAB_0010464c;
        if (uVar28 == 0x5d) {
          if ((local_188 == (json_value *)0x0) || (local_188->type != json_array)) {
            uVar20 = local_168._88_8_ & 0xffffffff;
            uVar18 = (ulong)local_168.cur_col;
            pcVar23 = "%d:%d: Unexpected ]";
            goto LAB_00104dcd;
          }
LAB_001044d9:
          uVar26 = (uVar24 & 0xffffff72) + 1;
          bVar6 = true;
          goto LAB_0010487a;
        }
        if ((uVar28 == 0xd) || (uVar28 == 0x20)) goto LAB_0010464c;
        if (uVar28 == 10) goto LAB_0010412a;
        if ((uVar24 & 4) != 0) {
          if (bVar11 == 0x2c) {
            uVar24 = uVar24 & 0xffffff7b;
            goto LAB_0010464c;
          }
          uVar18 = local_168._88_8_ & 0xffffffff;
          uVar19 = (ulong)local_168.cur_col;
          pcVar23 = "%d:%d: Expected , before %c";
          goto LAB_00104ece;
        }
        if ((uVar24 & 0x40) != 0) {
          if (bVar11 == 0x3a) {
            uVar24 = uVar24 & 0xffffff3b;
            goto LAB_0010464c;
          }
          uVar18 = local_168._88_8_ & 0xffffffff;
          uVar19 = (ulong)local_168.cur_col;
          pcVar23 = "%d:%d: Expected : before %c";
          goto LAB_00104ece;
        }
        uVar26 = uVar24 & 0xffffff33;
        if (bVar11 == 0x22) {
          iVar12 = new_value(&local_168,&local_188,&root,&local_100,json_string);
          if (iVar12 == 0) goto LAB_00105026;
          uVar24 = uVar26 | 0x20;
          local_198 = (_json_value *)(local_188->u).object.values;
          uVar18 = 0;
          goto LAB_0010464c;
        }
        if (uVar28 == 0x5b) {
          iVar12 = new_value(&local_168,&local_188,&root,&local_100,json_array);
          if (iVar12 == 0) goto LAB_00105026;
          goto LAB_0010464c;
        }
        if (uVar28 == 0x66) {
          if ((((3 < (long)pjVar25 - (long)pjVar27) &&
               (local_168.ptr = (char *)((long)&pjVar27->parent + 1),
               *(char *)((long)&pjVar27->parent + 1) == 'a')) &&
              (local_168.ptr = (char *)((long)&pjVar27->parent + 2),
              *(char *)((long)&pjVar27->parent + 2) == 'l')) &&
             ((local_168.ptr = (char *)((long)&pjVar27->parent + 3),
              *(char *)((long)&pjVar27->parent + 3) == 's' &&
              (local_168.ptr = (char *)((long)&pjVar27->parent + 4),
              *(char *)((long)&pjVar27->parent + 4) == 'e')))) {
            jVar3 = json_boolean;
LAB_00104bba:
            iVar12 = new_value(&local_168,&local_188,&root,&local_100,jVar3);
            if (iVar12 != 0) goto LAB_00104bd4;
            goto LAB_00105026;
          }
LAB_00104f8a:
          uVar20 = local_168._88_8_ & 0xffffffff;
          uVar18 = (ulong)local_168.cur_col;
          pcVar23 = "%d:%d: Unknown value";
          goto LAB_00104dcd;
        }
        if (uVar28 == 0x6e) {
          if (((2 < (long)pjVar25 - (long)pjVar27) &&
              (local_168.ptr = (char *)((long)&pjVar27->parent + 1),
              *(char *)((long)&pjVar27->parent + 1) == 'u')) &&
             ((local_168.ptr = (char *)((long)&pjVar27->parent + 2),
              *(char *)((long)&pjVar27->parent + 2) == 'l' &&
              (local_168.ptr = (char *)((long)&pjVar27->parent + 3),
              *(char *)((long)&pjVar27->parent + 3) == 'l')))) {
            jVar3 = json_null;
            goto LAB_00104bba;
          }
          goto LAB_00104f8a;
        }
        if (uVar28 == 0x74) {
          if (((((long)pjVar25 - (long)pjVar27 < 3) ||
               (local_168.ptr = (char *)((long)&pjVar27->parent + 1),
               *(char *)((long)&pjVar27->parent + 1) != 'r')) ||
              (local_168.ptr = (char *)((long)&pjVar27->parent + 2),
              *(char *)((long)&pjVar27->parent + 2) != 'u')) ||
             (local_168.ptr = (char *)((long)&pjVar27->parent + 3),
             *(char *)((long)&pjVar27->parent + 3) != 'e')) goto LAB_00104f8a;
          iVar12 = new_value(&local_168,&local_188,&root,&local_100,json_boolean);
          if (iVar12 == 0) goto LAB_00105026;
          (local_188->u).boolean = 1;
LAB_00104bd4:
          bVar6 = true;
          goto LAB_0010487a;
        }
        if (uVar28 == 0x7b) {
          local_178 = uVar18;
          iVar12 = new_value(&local_168,&local_188,&root,&local_100,json_object);
          uVar18 = local_178;
          uVar24 = uVar26;
          if (iVar12 != 0) goto LAB_0010464c;
LAB_00105026:
          error[0x12] = 'f';
          error[0x13] = 'a';
          error[0x14] = 'i';
          error[0x15] = 'l';
          error[0x16] = 'u';
          error[0x17] = 'r';
          error[0x18] = 'e';
          error[0x19] = '\0';
          builtin_strncpy(error + 8,"llocation ",10);
          error[0] = 'M';
          error[1] = 'e';
          error[2] = 'm';
          error[3] = 'o';
          error[4] = 'r';
          error[5] = 'y';
          error[6] = ' ';
          error[7] = 'a';
          goto LAB_00104ddc;
        }
        local_178 = uVar18;
        ppuVar13 = __ctype_b_loc();
        if (((*(byte *)((long)*ppuVar13 + (long)(char)bVar11 * 2 + 1) & 8) == 0) && (bVar11 != 0x2d)
           ) {
          uVar18 = local_168._88_8_ & 0xffffffff;
          uVar19 = (ulong)local_168._88_8_ >> 0x20;
          pcVar23 = "%d:%d: Unexpected %c when seeking value";
          goto LAB_00104ece;
        }
        iVar12 = new_value(&local_168,&local_188,&root,&local_100,json_integer);
        if (iVar12 == 0) goto LAB_00105026;
        if (local_168.first_pass != 0) {
          uVar18 = local_178;
          if (bVar11 != 0x2d) {
            uVar26 = uVar24 & 0xffffe033 | 2;
            local_180 = 0;
            local_f0 = 0;
            local_e8 = 0;
            goto LAB_0010487a;
          }
          uVar24 = uVar24 & 0xffffe033 | 0x100;
          local_180 = 0;
          local_f0 = 0;
          local_e8 = 0;
          goto LAB_0010464c;
        }
        while (((((*ppuVar13)[(char)uVar28] >> 0xb & 1) != 0 ||
                ((uVar28 - 0x2b < 0x3b &&
                 ((0x40000000400000dU >> ((ulong)(uVar28 - 0x2b) & 0x3f) & 1) != 0)))) &&
               (local_168.ptr = (char *)((long)(_json_value **)local_168.ptr + 1),
               (json_value *)local_168.ptr != pjVar25))) {
          uVar28 = (uint)*(byte *)&((json_value *)local_168.ptr)->parent;
        }
LAB_00104876:
        bVar6 = true;
        uVar18 = local_178;
        uVar26 = uVar26 | 3;
LAB_0010487a:
        if ((uVar26 & 2) != 0) {
          uVar26 = uVar26 & 0xfffffffd;
          local_168.ptr =
               (char *)((long)&((json_value *)((long)local_168.ptr + -0x28))->_reserved + 7);
        }
        uVar24 = uVar26;
        if (bVar6) {
          p_Var22 = local_188->parent;
          if (p_Var22 == (_json_value *)0x0) {
            bVar6 = false;
            uVar24 = uVar26 & 0xfffffffa | 0x84;
          }
          else {
            jVar3 = p_Var22->type;
            if (local_168.first_pass == 0) {
              if (jVar3 == json_array) {
                *(json_value **)((p_Var22->u).string.ptr + (ulong)(p_Var22->u).string.length * 8) =
                     local_188;
                p_Var22 = local_188->parent;
              }
              else if (jVar3 == json_object) {
                (p_Var22->u).object.values[(p_Var22->u).string.length].value = local_188;
              }
            }
            uVar24 = (p_Var22->u).boolean + 1;
            (p_Var22->u).string.length = uVar24;
            if (local_168.uint_max < uVar24) goto LAB_00104db8;
            bVar6 = false;
            local_188 = local_188->parent;
            uVar24 = (uint)(jVar3 == json_array) << 3 | uVar26 & 0xfffffffa | 4;
          }
        }
      }
      goto LAB_0010464c;
    }
    if (bVar11 == 9) goto LAB_0010464c;
    if (uVar28 == 10) {
LAB_0010412a:
      local_168.cur_col = 0;
      local_168.cur_line = local_168.cur_line + 1;
      goto LAB_0010464c;
    }
    if ((uVar28 == 0xd) || (uVar28 == 0x20)) goto LAB_0010464c;
    if (uVar28 != 0) {
      uVar18 = local_168._88_8_ & 0xffffffff;
      uVar19 = (ulong)local_168.cur_col;
      pcVar23 = "%d:%d: Trailing garbage: `%c`";
LAB_00104ece:
      uVar20 = (ulong)(uint)(int)(char)bVar11;
LAB_00104f16:
      sprintf(error,pcVar23,uVar18,uVar19,uVar20);
LAB_00104ddc:
      if (local_c0 != (char *)0x0) {
        if (error[0] == '\0') {
          builtin_strncpy(local_c0,"Unknown error",0xe);
        }
        else {
          strcpy(local_c0,error);
        }
      }
      pvVar8 = local_168.settings.user_data;
      p_Var7 = local_168.settings.mem_free;
      iVar12 = local_168.first_pass;
      ppjVar16 = &root;
      if (local_168.first_pass == 0) {
        ppjVar16 = &local_100;
      }
      pjVar25 = *ppjVar16;
      while (pjVar25 != (json_value *)0x0) {
        p_Var22 = (pjVar25->_reserved).next_alloc;
        (*p_Var7)(pjVar25,pvVar8);
        pjVar25 = p_Var22;
      }
      if (iVar12 == 0) {
        json_value_free_ex(&local_168.settings,root);
      }
      return (json_value *)0x0;
    }
    local_100 = root;
    iVar12 = local_168.first_pass + -1;
  } while( true );
}

Assistant:

json_value * json_parse_ex (json_settings * settings,
                            const json_char * json,
                            size_t length,
                            char * error_buf)
{
   json_char error [json_error_max];
   const json_char * end;
   json_value * top, * root, * alloc = 0;
   json_state state = { 0 };
   long flags;
   long num_digits = 0, num_e = 0;
   json_int_t num_fraction = 0;

   /* Skip UTF-8 BOM
    */
   if (length >= 3 && ((unsigned char) json [0]) == 0xEF
                   && ((unsigned char) json [1]) == 0xBB
                   && ((unsigned char) json [2]) == 0xBF)
   {
      json += 3;
      length -= 3;
   }

   error[0] = '\0';
   end = (json + length);

   memcpy (&state.settings, settings, sizeof (json_settings));

   if (!state.settings.mem_alloc)
      state.settings.mem_alloc = default_alloc;

   if (!state.settings.mem_free)
      state.settings.mem_free = default_free;

   memset (&state.uint_max, 0xFF, sizeof (state.uint_max));
   memset (&state.ulong_max, 0xFF, sizeof (state.ulong_max));

   state.uint_max -= 8; /* limit of how much can be added before next check */
   state.ulong_max -= 8;

   for (state.first_pass = 1; state.first_pass >= 0; -- state.first_pass)
   {
      json_uchar uchar;
      unsigned char uc_b1, uc_b2, uc_b3, uc_b4;
      json_char * string = 0;
      unsigned int string_length = 0;

      top = root = 0;
      flags = flag_seek_value;

      state.cur_line = 1;

      for (state.ptr = json ;; ++ state.ptr)
      {
         json_char b = (state.ptr == end ? 0 : *state.ptr);
         
         if (flags & flag_string)
         {
            if (!b)
            {  sprintf (error, "Unexpected EOF in string (at %d:%d)", line_and_col);
               goto e_failed;
            }

            if (string_length > state.uint_max)
               goto e_overflow;

            if (flags & flag_escaped)
            {
               flags &= ~ flag_escaped;

               switch (b)
               {
                  case 'b':  string_add ('\b');  break;
                  case 'f':  string_add ('\f');  break;
                  case 'n':  string_add ('\n');  break;
                  case 'r':  string_add ('\r');  break;
                  case 't':  string_add ('\t');  break;
                  case 'u':

                    if (end - state.ptr < 4 || 
                        (uc_b1 = hex_value (*++ state.ptr)) == 0xFF ||
                        (uc_b2 = hex_value (*++ state.ptr)) == 0xFF ||
                        (uc_b3 = hex_value (*++ state.ptr)) == 0xFF ||
                        (uc_b4 = hex_value (*++ state.ptr)) == 0xFF)
                    {
                        sprintf (error, "Invalid character value `%c` (at %d:%d)", b, line_and_col);
                        goto e_failed;
                    }

                    uc_b1 = (uc_b1 << 4) | uc_b2;
                    uc_b2 = (uc_b3 << 4) | uc_b4;
                    uchar = (uc_b1 << 8) | uc_b2;

                    if ((uchar & 0xF800) == 0xD800) {
                        json_uchar uchar2;
                        
                        if (end - state.ptr < 6 || (*++ state.ptr) != '\\' || (*++ state.ptr) != 'u' ||
                            (uc_b1 = hex_value (*++ state.ptr)) == 0xFF ||
                            (uc_b2 = hex_value (*++ state.ptr)) == 0xFF ||
                            (uc_b3 = hex_value (*++ state.ptr)) == 0xFF ||
                            (uc_b4 = hex_value (*++ state.ptr)) == 0xFF)
                        {
                            sprintf (error, "Invalid character value `%c` (at %d:%d)", b, line_and_col);
                            goto e_failed;
                        }

                        uc_b1 = (uc_b1 << 4) | uc_b2;
                        uc_b2 = (uc_b3 << 4) | uc_b4;
                        uchar2 = (uc_b1 << 8) | uc_b2;
                        
                        uchar = 0x010000 | ((uchar & 0x3FF) << 10) | (uchar2 & 0x3FF);
                    }

                    if (sizeof (json_char) >= sizeof (json_uchar) || (uchar <= 0x7F))
                    {
                       string_add ((json_char) uchar);
                       break;
                    }

                    if (uchar <= 0x7FF)
                    {
                        if (state.first_pass)
                           string_length += 2;
                        else
                        {  string [string_length ++] = 0xC0 | (uchar >> 6);
                           string [string_length ++] = 0x80 | (uchar & 0x3F);
                        }

                        break;
                    }

                    if (uchar <= 0xFFFF) {
                        if (state.first_pass)
                           string_length += 3;
                        else
                        {  string [string_length ++] = 0xE0 | (uchar >> 12);
                           string [string_length ++] = 0x80 | ((uchar >> 6) & 0x3F);
                           string [string_length ++] = 0x80 | (uchar & 0x3F);
                        }
                        
                        break;
                    }

                    if (state.first_pass)
                       string_length += 4;
                    else
                    {  string [string_length ++] = 0xF0 | (uchar >> 18);
                       string [string_length ++] = 0x80 | ((uchar >> 12) & 0x3F);
                       string [string_length ++] = 0x80 | ((uchar >> 6) & 0x3F);
                       string [string_length ++] = 0x80 | (uchar & 0x3F);
                    }

                    break;

                  default:
                     string_add (b);
               };

               continue;
            }

            if (b == '\\')
            {
               flags |= flag_escaped;
               continue;
            }

            if (b == '"')
            {
               if (!state.first_pass)
                  string [string_length] = 0;

               flags &= ~ flag_string;
               string = 0;

               switch (top->type)
               {
                  case json_string:

                     top->u.string.length = string_length;
                     flags |= flag_next;

                     break;

                  case json_object:

                     if (state.first_pass)
                        (*(json_char **) &top->u.object.values) += string_length + 1;
                     else
                     {  
                        top->u.object.values [top->u.object.length].name
                           = (json_char *) top->_reserved.object_mem;

                        top->u.object.values [top->u.object.length].name_length
                           = string_length;

                        (*(json_char **) &top->_reserved.object_mem) += string_length + 1;
                     }

                     flags |= flag_seek_value | flag_need_colon;
                     continue;

                  default:
                     break;
               };
            }
            else
            {
               string_add (b);
               continue;
            }
         }

         if (state.settings.settings & json_enable_comments)
         {
            if (flags & (flag_line_comment | flag_block_comment))
            {
               if (flags & flag_line_comment)
               {
                  if (b == '\r' || b == '\n' || !b)
                  {
                     flags &= ~ flag_line_comment;
                     -- state.ptr;  /* so null can be reproc'd */
                  }

                  continue;
               }

               if (flags & flag_block_comment)
               {
                  if (!b)
                  {  sprintf (error, "%d:%d: Unexpected EOF in block comment", line_and_col);
                     goto e_failed;
                  }

                  if (b == '*' && state.ptr < (end - 1) && state.ptr [1] == '/')
                  {
                     flags &= ~ flag_block_comment;
                     ++ state.ptr;  /* skip closing sequence */
                  }

                  continue;
               }
            }
            else if (b == '/')
            {
               if (! (flags & (flag_seek_value | flag_done)) && top->type != json_object)
               {  sprintf (error, "%d:%d: Comment not allowed here", line_and_col);
                  goto e_failed;
               }

               if (++ state.ptr == end)
               {  sprintf (error, "%d:%d: EOF unexpected", line_and_col);
                  goto e_failed;
               }

               switch (b = *state.ptr)
               {
                  case '/':
                     flags |= flag_line_comment;
                     continue;

                  case '*':
                     flags |= flag_block_comment;
                     continue;

                  default:
                     sprintf (error, "%d:%d: Unexpected `%c` in comment opening sequence", line_and_col, b);
                     goto e_failed;
               };
            }
         }

         if (flags & flag_done)
         {
            if (!b)
               break;

            switch (b)
            {
               whitespace:
                  continue;

               default:

                  sprintf (error, "%d:%d: Trailing garbage: `%c`",
                           state.cur_line, state.cur_col, b);

                  goto e_failed;
            };
         }

         if (flags & flag_seek_value)
         {
            switch (b)
            {
               whitespace:
                  continue;

               case ']':

                  if (top && top->type == json_array)
                     flags = (flags & ~ (flag_need_comma | flag_seek_value)) | flag_next;
                  else
                  {  sprintf (error, "%d:%d: Unexpected ]", line_and_col);
                     goto e_failed;
                  }

                  break;

               default:

                  if (flags & flag_need_comma)
                  {
                     if (b == ',')
                     {  flags &= ~ flag_need_comma;
                        continue;
                     }
                     else
                     {
                        sprintf (error, "%d:%d: Expected , before %c",
                                 state.cur_line, state.cur_col, b);

                        goto e_failed;
                     }
                  }

                  if (flags & flag_need_colon)
                  {
                     if (b == ':')
                     {  flags &= ~ flag_need_colon;
                        continue;
                     }
                     else
                     { 
                        sprintf (error, "%d:%d: Expected : before %c",
                                 state.cur_line, state.cur_col, b);

                        goto e_failed;
                     }
                  }

                  flags &= ~ flag_seek_value;

                  switch (b)
                  {
                     case '{':

                        if (!new_value (&state, &top, &root, &alloc, json_object))
                           goto e_alloc_failure;

                        continue;

                     case '[':

                        if (!new_value (&state, &top, &root, &alloc, json_array))
                           goto e_alloc_failure;

                        flags |= flag_seek_value;
                        continue;

                     case '"':

                        if (!new_value (&state, &top, &root, &alloc, json_string))
                           goto e_alloc_failure;

                        flags |= flag_string;

                        string = top->u.string.ptr;
                        string_length = 0;

                        continue;

                     case 't':

                        if ((end - state.ptr) < 3 || *(++ state.ptr) != 'r' ||
                            *(++ state.ptr) != 'u' || *(++ state.ptr) != 'e')
                        {
                           goto e_unknown_value;
                        }

                        if (!new_value (&state, &top, &root, &alloc, json_boolean))
                           goto e_alloc_failure;

                        top->u.boolean = 1;

                        flags |= flag_next;
                        break;

                     case 'f':

                        if ((end - state.ptr) < 4 || *(++ state.ptr) != 'a' ||
                            *(++ state.ptr) != 'l' || *(++ state.ptr) != 's' ||
                            *(++ state.ptr) != 'e')
                        {
                           goto e_unknown_value;
                        }

                        if (!new_value (&state, &top, &root, &alloc, json_boolean))
                           goto e_alloc_failure;

                        flags |= flag_next;
                        break;

                     case 'n':

                        if ((end - state.ptr) < 3 || *(++ state.ptr) != 'u' ||
                            *(++ state.ptr) != 'l' || *(++ state.ptr) != 'l')
                        {
                           goto e_unknown_value;
                        }

                        if (!new_value (&state, &top, &root, &alloc, json_null))
                           goto e_alloc_failure;

                        flags |= flag_next;
                        break;

                     default:

                        if (isdigit (b) || b == '-')
                        {
                           if (!new_value (&state, &top, &root, &alloc, json_integer))
                              goto e_alloc_failure;

                           if (!state.first_pass)
                           {
                              while (isdigit (b) || b == '+' || b == '-'
                                        || b == 'e' || b == 'E' || b == '.')
                              {
                                 if ( (++ state.ptr) == end)
                                 {
                                    b = 0;
                                    break;
                                 }

                                 b = *state.ptr;
                              }

                              flags |= flag_next | flag_reproc;
                              break;
                           }

                           flags &= ~ (flag_num_negative | flag_num_e |
                                        flag_num_e_got_sign | flag_num_e_negative |
                                           flag_num_zero);

                           num_digits = 0;
                           num_fraction = 0;
                           num_e = 0;

                           if (b != '-')
                           {
                              flags |= flag_reproc;
                              break;
                           }

                           flags |= flag_num_negative;
                           continue;
                        }
                        else
                        {  sprintf (error, "%d:%d: Unexpected %c when seeking value", line_and_col, b);
                           goto e_failed;
                        }
                  };
            };
         }
         else
         {
            switch (top->type)
            {
            case json_object:
               
               switch (b)
               {
                  whitespace:
                     continue;

                  case '"':

                     if (flags & flag_need_comma)
                     {  sprintf (error, "%d:%d: Expected , before \"", line_and_col);
                        goto e_failed;
                     }

                     flags |= flag_string;

                     string = (json_char *) top->_reserved.object_mem;
                     string_length = 0;

                     break;
                  
                  case '}':

                     flags = (flags & ~ flag_need_comma) | flag_next;
                     break;

                  case ',':

                     if (flags & flag_need_comma)
                     {
                        flags &= ~ flag_need_comma;
                        break;
                     }

                  default:
                     sprintf (error, "%d:%d: Unexpected `%c` in object", line_and_col, b);
                     goto e_failed;
               };

               break;

            case json_integer:
            case json_double:

               if (isdigit (b))
               {
                  ++ num_digits;

                  if (top->type == json_integer || flags & flag_num_e)
                  {
                     if (! (flags & flag_num_e))
                     {
                        if (flags & flag_num_zero)
                        {  sprintf (error, "%d:%d: Unexpected `0` before `%c`", line_and_col, b);
                           goto e_failed;
                        }

                        if (num_digits == 1 && b == '0')
                           flags |= flag_num_zero;
                     }
                     else
                     {
                        flags |= flag_num_e_got_sign;
                        num_e = (num_e * 10) + (b - '0');
                        continue;
                     }

                     top->u.integer = (top->u.integer * 10) + (b - '0');
                     continue;
                  }

                  num_fraction = (num_fraction * 10) + (b - '0');
                  continue;
               }

               if (b == '+' || b == '-')
               {
                  if ( (flags & flag_num_e) && !(flags & flag_num_e_got_sign))
                  {
                     flags |= flag_num_e_got_sign;

                     if (b == '-')
                        flags |= flag_num_e_negative;

                     continue;
                  }
               }
               else if (b == '.' && top->type == json_integer)
               {
                  if (!num_digits)
                  {  sprintf (error, "%d:%d: Expected digit before `.`", line_and_col);
                     goto e_failed;
                  }

                  top->type = json_double;
                  top->u.dbl = (double) top->u.integer;

                  num_digits = 0;
                  continue;
               }

               if (! (flags & flag_num_e))
               {
                  if (top->type == json_double)
                  {
                     if (!num_digits)
                     {  sprintf (error, "%d:%d: Expected digit after `.`", line_and_col);
                        goto e_failed;
                     }

                     top->u.dbl += ((double) num_fraction) / (pow (10.0, (double) num_digits));
                  }

                  if (b == 'e' || b == 'E')
                  {
                     flags |= flag_num_e;

                     if (top->type == json_integer)
                     {
                        top->type = json_double;
                        top->u.dbl = (double) top->u.integer;
                     }

                     num_digits = 0;
                     flags &= ~ flag_num_zero;

                     continue;
                  }
               }
               else
               {
                  if (!num_digits)
                  {  sprintf (error, "%d:%d: Expected digit after `e`", line_and_col);
                     goto e_failed;
                  }

                  top->u.dbl *= pow (10.0, (double)
                      (flags & flag_num_e_negative ? - num_e : num_e));
               }

               if (flags & flag_num_negative)
               {
                  if (top->type == json_integer)
                     top->u.integer = - top->u.integer;
                  else
                     top->u.dbl = - top->u.dbl;
               }

               flags |= flag_next | flag_reproc;
               break;

            default:
               break;
            };
         }

         if (flags & flag_reproc)
         {
            flags &= ~ flag_reproc;
            -- state.ptr;
         }

         if (flags & flag_next)
         {
            flags = (flags & ~ flag_next) | flag_need_comma;

            if (!top->parent)
            {
               /* root value done */

               flags |= flag_done;
               continue;
            }

            if (top->parent->type == json_array)
               flags |= flag_seek_value;
               
            if (!state.first_pass)
            {
               json_value * parent = top->parent;

               switch (parent->type)
               {
                  case json_object:

                     parent->u.object.values
                        [parent->u.object.length].value = top;

                     break;

                  case json_array:

                     parent->u.array.values
                           [parent->u.array.length] = top;

                     break;

                  default:
                     break;
               };
            }

            if ( (++ top->parent->u.array.length) > state.uint_max)
               goto e_overflow;

            top = top->parent;

            continue;
         }
      }

      alloc = root;
   }

   return root;

e_unknown_value:

   sprintf (error, "%d:%d: Unknown value", line_and_col);
   goto e_failed;

e_alloc_failure:

   strcpy (error, "Memory allocation failure");
   goto e_failed;

e_overflow:

   sprintf (error, "%d:%d: Too long (caught overflow)", line_and_col);
   goto e_failed;

e_failed:

   if (error_buf)
   {
      if (*error)
         strcpy (error_buf, error);
      else
         strcpy (error_buf, "Unknown error");
   }

   if (state.first_pass)
      alloc = root;

   while (alloc)
   {
      top = alloc->_reserved.next_alloc;
      state.settings.mem_free (alloc, state.settings.user_data);
      alloc = top;
   }

   if (!state.first_pass)
      json_value_free_ex (&state.settings, root);

   return 0;
}